

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O0

location * toml::detail::make_temporary_location(string *str)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  location *in_RDI;
  container_type cont;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string *src_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  location *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__args;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_29;
  
  __n = in_RDI;
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   (in_RSI);
  __args = &local_29;
  CLI::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x660588);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this,(size_type)__n,(allocator_type *)in_RDI);
  CLI::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&local_29);
  cVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          begin(in_stack_ffffffffffffff38);
  cVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    (in_stack_ffffffffffffff48);
  iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff38);
  src = std::
        transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,toml::detail::make_temporary_location(std::__cxx11::string_const&)::_lambda(char_const&)_1_>
                  (cVar1._M_current,cVar2._M_current,iVar3._M_current);
  std::
  make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (__args);
  src_name = (string *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  location::location(in_RDI,(source_ptr *)src._M_current,src_name);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src_name);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  CLI::std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  ~shared_ptr((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              0x66068a);
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  return __n;
}

Assistant:

TOML11_INLINE location make_temporary_location(const std::string& str) noexcept
{
    location::container_type cont(str.size());
    std::transform(str.begin(), str.end(), cont.begin(),
        [](const std::string::value_type& c) {
            return cxx::bit_cast<location::char_type>(c);
        });
    return location(std::make_shared<const location::container_type>(
            std::move(cont)), "internal temporary");
}